

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  bool bVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  value_type *pvVar9;
  region retval;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region local_120;
  const_iterator *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  region local_c8;
  result<toml::detail::region,_toml::detail::none_t> local_80;
  
  region::region(&local_120,loc);
  rollback._M_current = (loc->iter_)._M_current;
  bVar8 = true;
  do {
    bVar3 = bVar8;
    if (!bVar3) goto LAB_0011f49e;
    either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_80,loc);
    bVar7 = local_80.is_ok_;
    if (local_80.is_ok_ == false) {
      location::reset(loc,rollback);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      pvVar9 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_80);
      if ((local_120.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr !=
           (pvVar9->source_).
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr) || (local_120.last_._M_current != (pvVar9->first_)._M_current))
      goto LAB_0011f651;
      local_120.last_._M_current = (pvVar9->last_)._M_current;
    }
    if (local_80.is_ok_ == true) {
      region::~region(&local_80.field_1.succ.value);
    }
    bVar8 = false;
  } while (bVar7 != false);
  if (!bVar3) {
LAB_0011f49e:
    paVar2 = &local_c8.source_name_.field_2;
    paVar1 = &local_120.source_name_.field_2;
    local_d0 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    local_d8 = &(__return_storage_ptr__->field_1).succ.value.first_;
    do {
      either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_80,loc);
      bVar8 = local_80.is_ok_;
      sVar6 = local_120.source_name_._M_string_length;
      _Var5._M_pi = local_120.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_120.source_.
               super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (local_80.is_ok_ == false) {
        local_c8.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001c9670;
        local_120.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_120.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.source_name_._M_dataplus._M_p == paVar1) {
          local_c8.source_name_.field_2._8_8_ = local_120.source_name_.field_2._8_8_;
          local_c8.source_name_._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_c8.source_name_._M_dataplus._M_p = local_120.source_name_._M_dataplus._M_p;
        }
        local_c8.source_name_.field_2._M_allocated_capacity._1_7_ =
             local_120.source_name_.field_2._M_allocated_capacity._1_7_;
        local_c8.source_name_.field_2._M_local_buf[0] =
             local_120.source_name_.field_2._M_local_buf[0];
        local_120.source_name_._M_string_length = 0;
        local_120.source_name_.field_2._M_local_buf[0] = '\0';
        local_c8.first_._M_current = local_120.first_._M_current;
        local_c8.last_._M_current = local_120.last_._M_current;
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
             (_func_int **)&PTR__region_001c9670;
        (__return_storage_ptr__->field_1).succ.value.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        (__return_storage_ptr__->field_1).succ.value.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__return_storage_ptr__->field_1).succ.value.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = _Var5._M_pi;
        local_c8.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&__return_storage_ptr__->field_1 + 0x18) = local_d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.source_name_._M_dataplus._M_p == paVar2) {
          local_d0->_M_allocated_capacity = local_c8.source_name_.field_2._M_allocated_capacity;
          (&local_d0->_M_allocated_capacity)[1] = local_c8.source_name_.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
               local_c8.source_name_._M_dataplus._M_p;
          (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
               local_c8.source_name_.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
        local_c8.source_name_._M_string_length = 0;
        local_c8.source_name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_120.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
        local_d8->_M_current = local_120.first_._M_current;
        local_d8[1]._M_current = local_120.last_._M_current;
        local_120.source_name_._M_dataplus._M_p = (pointer)paVar1;
        local_c8.source_name_._M_dataplus._M_p = (pointer)paVar2;
        region::~region(&local_c8);
      }
      else {
        pvVar9 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_80);
        if ((local_120.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr !=
             (pvVar9->source_).
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr) || (local_120.last_._M_current != (pvVar9->first_)._M_current)) {
LAB_0011f651:
          __assert_fail("this->source_ == other.source_ && this->last_ == other.first_",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/region.hpp"
                        ,0xe6,"region &toml::detail::region::operator+=(const region &)");
        }
        local_120.last_._M_current = (pvVar9->last_)._M_current;
      }
      if (local_80.is_ok_ == true) {
        region::~region(&local_80.field_1.succ.value);
      }
    } while (bVar8 != false);
  }
  region::~region(&local_120);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }